

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::f_store(Forth *this)

{
  uint pointer;
  double x;
  
  requireDStackDepth(this,1,"F!");
  requireFStackDepth(this,1,"F!");
  pointer = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  x = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  setDataCell(this,pointer,&x);
  return;
}

Assistant:

void f_store() {
			REQUIRE_DSTACK_DEPTH(1, "F!");
			REQUIRE_FSTACK_DEPTH(1, "F!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "F!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell(aaddr, x);
		}